

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase419::run(TestCase419 *this)

{
  Reader reader_00;
  size_t sVar1;
  size_t sVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_unsigned_char> packedBytes_00;
  ReaderOptions options;
  TestPipe pipe;
  Reader local_2a0;
  Builder local_270;
  PackedMessageReader reader;
  TestMessageBuilder builder;
  
  TestMessageBuilder::TestMessageBuilder(&builder,3);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&pipe,(MessageBuilder *)&builder);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField
            ((Builder *)&reader,(Builder *)&pipe);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField(&local_270,(Builder *)&reader)
  ;
  pipe.super_BufferedInputStream.super_InputStream._vptr_InputStream =
       (InputStream)&PTR__TestPipe_00393a70;
  pipe.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__TestPipe_00393ab0;
  pipe.preferredReadSize = 0xffffffffffffffff;
  pipe.data._M_dataplus._M_p = (pointer)&pipe.data.field_2;
  pipe.data._M_string_length = 0;
  pipe.data.field_2._M_local_buf[0] = '\0';
  pipe.readPos = 0;
  writePackedMessage(&pipe.super_OutputStream,(MessageBuilder *)&builder);
  sVar1 = computeSerializedSizeInWords((MessageBuilder *)&builder);
  packedBytes.size_ = extraout_RDX;
  packedBytes.ptr = (uchar *)pipe.data._M_string_length;
  sVar2 = computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes);
  if ((sVar1 != sVar2) && (kj::_::Debug::minSeverity < 3)) {
    reader.super_PackedInputStream.super_InputStream._vptr_InputStream =
         (_func_int **)computeSerializedSizeInWords((MessageBuilder *)&builder);
    packedBytes_00.size_ = extraout_RDX_00;
    packedBytes_00.ptr = (uchar *)pipe.data._M_string_length;
    local_270._builder.segment =
         (SegmentBuilder *)
         computeUnpackedSizeInWords((capnp *)pipe.data._M_dataplus._M_p,packedBytes_00);
    kj::_::Debug::log<char_const(&)[106],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
               ,0x1aa,ERROR,
               "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
               ,(char (*) [106])
                "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
               ,(unsigned_long *)&reader,(unsigned_long *)&local_270);
  }
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  PackedMessageReader::PackedMessageReader
            (&reader,&pipe.super_BufferedInputStream,options,(ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_2a0,&reader.super_InputStreamMessageReader.super_MessageReader);
  reader_00._reader.capTable = local_2a0._reader.capTable;
  reader_00._reader.segment = local_2a0._reader.segment;
  reader_00._reader.data = local_2a0._reader.data;
  reader_00._reader.pointers = local_2a0._reader.pointers;
  reader_00._reader.dataSize = local_2a0._reader.dataSize;
  reader_00._reader.pointerCount = local_2a0._reader.pointerCount;
  reader_00._reader._38_2_ = local_2a0._reader._38_2_;
  reader_00._reader.nestingLimit = local_2a0._reader.nestingLimit;
  reader_00._reader._44_4_ = local_2a0._reader._44_4_;
  checkTestMessageAllZero(reader_00);
  PackedMessageReader::~PackedMessageReader(&reader);
  TestPipe::~TestPipe(&pipe);
  TestMessageBuilder::~TestMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Packed, RoundTripAllZeroOddSegmentCount) {
  TestMessageBuilder builder(3);
  builder.initRoot<TestAllTypes>().initStructField().initStructField();

  TestPipe pipe;
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  checkTestMessageAllZero(reader.getRoot<TestAllTypes>());
}